

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetXcFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *lang,string *config,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  cmLocalGenerator *this_01;
  cmValue cVar3;
  cmValue cVar4;
  cmComputeLinkInformation *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  pointer dir;
  string_view source;
  string local_50;
  
  this_01 = cmGeneratorTarget::GetLocalGenerator(target);
  this_00 = this_01->Makefile;
  bVar2 = cmGeneratorTarget::IsApple(target);
  if (bVar2) {
    cmStrCat<char_const(&)[20],std::__cxx11::string_const&>
              (&local_50,(char (*) [20])"CMAKE_INCLUDE_FLAG_",lang);
    cVar3 = cmMakefile::GetDefinition(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&>(&local_50,(char (*) [27])0x724e7b,lang);
    cVar4 = cmMakefile::GetDefinition(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((cVar3.Value != (string *)0x0 || cVar4.Value != (string *)0x0) &&
       (this_02 = cmGeneratorTarget::GetLinkInformation(target,config),
       this_02 != (cmComputeLinkInformation *)0x0)) {
      pvVar5 = cmComputeLinkInformation::GetXcFrameworkHeaderPaths_abi_cxx11_(this_02);
      pbVar1 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (dir = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; dir != pbVar1; dir = dir + 1) {
        if (cVar4.Value != (string *)0x0) {
          cmGeneratorTarget::IsSystemIncludeDirectory(target,dir,config,lang);
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        source._M_str = (dir->_M_dataplus)._M_p;
        source._M_len = dir->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_50,&this_01->super_cmOutputConverter,source,SHELL,false);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetXcFrameworkFlags(std::string const& lang,
                                                  std::string const& config,
                                                  cmGeneratorTarget* target)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  cmMakefile* mf = lg->GetMakefile();

  if (!target->IsApple()) {
    return std::string();
  }

  cmValue includeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  cmValue sysIncludeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));

  if (!includeSearchFlag && !sysIncludeSearchFlag) {
    return std::string{};
  }

  std::string flags;
  if (cmComputeLinkInformation* cli = target->GetLinkInformation(config)) {
    std::vector<std::string> const& paths = cli->GetXcFrameworkHeaderPaths();
    for (std::string const& path : paths) {
      if (sysIncludeSearchFlag &&
          target->IsSystemIncludeDirectory(path, config, lang)) {
        flags += *sysIncludeSearchFlag;
      } else {
        flags += *includeSearchFlag;
      }
      flags += lg->ConvertToOutputFormat(path, cmOutputConverter::SHELL);
      flags += " ";
    }
  }
  return flags;
}